

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> * __thiscall
Descriptor::detect(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
                  Descriptor *this,Mat *image)

{
  Size_<int> local_88;
  Size_<int> local_80;
  _InputArray local_78;
  undefined1 local_5d;
  vector<float,_std::allocator<float>_> local_50;
  _InputArray local_38;
  Mat *local_20;
  Mat *image_local;
  Descriptor *this_local;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *detected;
  
  local_20 = image;
  image_local = (Mat *)this;
  this_local = (Descriptor *)__return_storage_ptr__;
  cv::HOGDescriptor::getDefaultPeopleDetector();
  cv::_InputArray::_InputArray<float>(&local_38,&local_50);
  cv::HOGDescriptor::setSVMDetector((_InputArray *)&this->descriptor);
  cv::_InputArray::~_InputArray(&local_38);
  std::vector<float,_std::allocator<float>_>::~vector(&local_50);
  local_5d = 0;
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector(__return_storage_ptr__);
  cv::_InputArray::_InputArray(&local_78,image);
  cv::Size_<int>::Size_(&local_80,8,8);
  cv::Size_<int>::Size_(&local_88);
  cv::HOGDescriptor::detectMultiScale
            (0,0x3ff0cccccccccccd,0x4000000000000000,&this->descriptor,&local_78,
             __return_storage_ptr__,&local_80,&local_88,0);
  cv::_InputArray::~_InputArray(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Rect> Descriptor::detect(cv::Mat image) {
  // use trained svm from opencv
  descriptor.setSVMDetector(cv::HOGDescriptor::getDefaultPeopleDetector());
  std::vector<cv::Rect> detected;
  descriptor.detectMultiScale(image, detected, 0, cv::Size(8, 8), cv::Size(),
                              1.05, 2, false);  // using appropriate parameters
  return detected;
}